

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thstd.c
# Opt level: O3

void std_write(thstd_t *std,char *filename)

{
  void *pvVar1;
  thstd_t *ptVar2;
  FILE *__stream;
  size_t size;
  list_node_t *plVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong size_00;
  uint32_t entry_offset;
  int32_t endcode;
  uint local_40 [2];
  thstd_t *local_38;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    std_write_cold_1();
  }
  size_00 = (ulong)(option_version == 0) << 10 | 0x90;
  file_write((FILE *)__stream,(&std->header_06)[option_version != 0],size_00);
  local_40[0] = (int)size_00 + (uint)std->header->nb_objects * 4;
  plVar3 = (std->entries).head;
  local_38 = std;
  if (plVar3 != (list_node_t *)0x0) {
    lVar5 = 0;
    do {
      puVar4 = (undefined8 *)plVar3->data;
      *(short *)*puVar4 = (short)lVar5;
      file_seek((FILE *)__stream,size_00 + lVar5 * 4);
      file_write((FILE *)__stream,local_40,4);
      file_seek((FILE *)__stream,(ulong)local_40[0]);
      file_write((FILE *)__stream,(void *)*puVar4,0x1c);
      for (puVar4 = (undefined8 *)puVar4[1]; local_40[0] = local_40[0] + 0x1c,
          puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
        pvVar1 = (void *)puVar4[2];
        *(undefined2 *)((long)pvVar1 + 2) = 0x1c;
        file_write((FILE *)__stream,pvVar1,0x1c);
      }
      local_40[1] = 0x4ffff;
      file_write((FILE *)__stream,local_40 + 1,4);
      local_40[0] = local_40[0] + 4;
      lVar5 = lVar5 + 1;
      plVar3 = plVar3->next;
    } while (plVar3 != (list_node_t *)0x0);
  }
  ptVar2 = local_38;
  for (plVar3 = (local_38->instances).head; plVar3 != (list_node_t *)0x0; plVar3 = plVar3->next) {
    file_write((FILE *)__stream,plVar3->data,0x10);
  }
  local_40[1] = 0xffffffff;
  lVar5 = 4;
  do {
    file_write((FILE *)__stream,local_40 + 1,4);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  for (plVar3 = (ptVar2->instrs).head; plVar3 != (list_node_t *)0x0; plVar3 = plVar3->next) {
    pvVar1 = plVar3->data;
    if (option_version == 0) {
      *(undefined2 *)((long)pvVar1 + 6) = 0xc;
      size = 0x14;
    }
    else {
      size = (size_t)*(ushort *)((long)pvVar1 + 6);
    }
    file_write((FILE *)__stream,pvVar1,size);
  }
  lVar5 = 5;
  do {
    file_write((FILE *)__stream,local_40 + 1,4);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  fclose(__stream);
  return;
}

Assistant:

static void
std_write(
          thstd_t* std,
          const char *filename)
{
    FILE *stream;
    size_t i;
    std_entry_t *entry;
    std_object_t *quad;
    std_object_instance_t *instance;
    std_instr_t *instr;
    uint32_t offset;
    uint32_t entry_offset;
    int32_t endcode;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, filename, strerror(errno));
    }

    if (option_version == 0) {
        file_write(stream, std->header_06, sizeof(std_header_06_t));
        offset = sizeof(std_header_06_t);
    } else {
        file_write(stream, std->header_10, sizeof(std_header_10_t));
        offset = sizeof(std_header_10_t);
    }


    entry_offset = (offset +
                    sizeof(int32_t) * (uint32_t)std->header->nb_objects);

    i = 0;
    list_for_each(&std->entries, entry) {
        entry->header->id = i;

        file_seek(stream, offset + i*sizeof(int32_t));
        file_write(stream, &entry_offset, sizeof(uint32_t));

        file_seek(stream, entry_offset);
        file_write(stream, entry->header, sizeof(std_entry_header_t));
        entry_offset += sizeof(std_entry_header_t);

        list_for_each(&entry->quads, quad) {
            quad->size = 0x1c;
            file_write(stream, quad, sizeof(std_object_t));
            entry_offset += sizeof(std_object_t);
        }

        endcode = 0x0004FFFF;
        file_write(stream, &endcode, sizeof(int32_t));
        entry_offset += sizeof(int32_t);

        i++;
    }

    list_for_each(&std->instances, instance) {
        file_write(stream, instance, sizeof(std_object_instance_t));
    }

    endcode = 0xFFFFFFFF;
    for(i = 0; i < 4; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    list_for_each(&std->instrs, instr) {
        if (option_version == 0) {
            instr->size = 12;
            file_write(stream, instr, instr->size + sizeof(uint32_t) * 2);
        }
        else
            file_write(stream, instr, instr->size);
    }

    for(i = 0; i < 5; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    fclose(stream);
}